

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_fixed.hpp
# Opt level: O2

void __thiscall
protozero::fixed_size_buffer_adaptor::append_zeros(fixed_size_buffer_adaptor *this,size_t count)

{
  length_error *this_00;
  size_t __len;
  ulong uVar1;
  
  uVar1 = this->m_size + count;
  if (uVar1 <= this->m_capacity) {
    if (count != 0) {
      memset(this->m_data + this->m_size,0,count);
      uVar1 = count + this->m_size;
    }
    this->m_size = uVar1;
    return;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this_00,"fixed size data store exhausted");
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

void append_zeros(std::size_t count) {
        if (m_size + count > m_capacity) {
            throw std::length_error{"fixed size data store exhausted"};
        }
        std::fill_n(m_data + m_size, count, '\0');
        m_size += count;
    }